

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_blockhash.cpp
# Opt level: O3

void __thiscall
BlockHash_Constractor_bytedata_Test::~BlockHash_Constractor_bytedata_Test
          (BlockHash_Constractor_bytedata_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BlockHash, Constractor_bytedata) {
  ByteData256 bytes(
      "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  BlockHash blockhash(bytes);
  EXPECT_STREQ(
      blockhash.GetHex().c_str(),
      "7981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18");
  EXPECT_EQ(blockhash.GetData().GetDataSize(), 32);
  EXPECT_STREQ(
      blockhash.GetData().GetHex().c_str(),
      "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
}